

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr val;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlChar *pxVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  
  if (nargs == 0) {
    pxVar3 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar3);
  }
  else {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    if (nargs != 1) {
      iVar7 = 0xc;
      goto LAB_001c1800;
    }
  }
  iVar7 = ctxt->valueNr;
  if ((long)iVar7 < 1) {
    iVar7 = 0x17;
LAB_001c1800:
    xmlXPathErr(ctxt,iVar7);
    return;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    iVar7 = 0xb;
    goto LAB_001c1800;
  }
  uVar6 = iVar7 - 1;
  ctxt->valueNr = uVar6;
  ppxVar1 = ctxt->valueTab;
  if (iVar7 == 1) {
    pxVar3 = (xmlXPathObjectPtr)0x0;
  }
  else {
    pxVar3 = ppxVar1[(long)iVar7 + -2];
  }
  ctxt->value = pxVar3;
  pxVar3 = ppxVar1[uVar6];
  ppxVar1[uVar6] = (xmlXPathObjectPtr)0x0;
  pxVar2 = pxVar3->nodesetval;
  if ((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) {
LAB_001c184b:
    pxVar8 = "";
LAB_001c1852:
    pxVar4 = xmlXPathCacheNewString(ctxt,pxVar8);
  }
  else {
    val = *pxVar2->nodeTab;
    if (1 < val->type - XML_ELEMENT_NODE) {
      pxVar4 = xmlXPathCacheNewNodeSet(ctxt,val);
      xmlXPathValuePush(ctxt,pxVar4);
      xmlXPathLocalNameFunction(ctxt,1);
      goto LAB_001c1865;
    }
    pxVar8 = val->name;
    if (*pxVar8 == ' ') goto LAB_001c184b;
    if ((val->ns == (xmlNs *)0x0) || (pxVar5 = val->ns->prefix, pxVar5 == (xmlChar *)0x0))
    goto LAB_001c1852;
    pxVar5 = xmlBuildQName(pxVar8,pxVar5,(xmlChar *)0x0,0);
    pxVar8 = (*pxVar3->nodesetval->nodeTab)->name;
    if (pxVar5 == pxVar8) {
      pxVar5 = xmlStrdup(pxVar8);
    }
    if (pxVar5 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      pxVar5 = (xmlChar *)0x0;
    }
    pxVar4 = xmlXPathCacheWrapString(ctxt,pxVar5);
  }
  xmlXPathValuePush(ctxt,pxVar4);
LAB_001c1865:
  xmlXPathReleaseObject(ctxt->context,pxVar3);
  return;
}

Assistant:

static void
xmlXPathNameFunction(xmlXPathParserContextPtr ctxt, int nargs)
{
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
        nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
        ((ctxt->value->type != XPATH_NODESET) &&
         (ctxt->value->type != XPATH_XSLT_TREE)))
        XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
        xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
        int i = 0;              /* Should be first in document order !!!!! */

        switch (cur->nodesetval->nodeTab[i]->type) {
            case XML_ELEMENT_NODE:
            case XML_ATTRIBUTE_NODE:
		if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		    xmlXPathValuePush(ctxt,
			xmlXPathCacheNewCString(ctxt, ""));
		else if ((cur->nodesetval->nodeTab[i]->ns == NULL) ||
                         (cur->nodesetval->nodeTab[i]->ns->prefix == NULL)) {
		    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			    cur->nodesetval->nodeTab[i]->name));
		} else {
		    xmlChar *fullname;

		    fullname = xmlBuildQName(cur->nodesetval->nodeTab[i]->name,
				     cur->nodesetval->nodeTab[i]->ns->prefix,
				     NULL, 0);
		    if (fullname == cur->nodesetval->nodeTab[i]->name)
			fullname = xmlStrdup(cur->nodesetval->nodeTab[i]->name);
		    if (fullname == NULL)
                        xmlXPathPErrMemory(ctxt);
		    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, fullname));
                }
                break;
            default:
		xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		    cur->nodesetval->nodeTab[i]));
                xmlXPathLocalNameFunction(ctxt, 1);
        }
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}